

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O0

TWordId __thiscall NJamSpell::TLangModel::GetWordIdNoCreate(TLangModel *this,TWord *word)

{
  wchar_t *pwVar1;
  ulong uVar2;
  bool bVar3;
  pointer pvVar4;
  iterator_bucket local_68;
  iterator_bucket local_60;
  const_iterator it;
  allocator local_41;
  wstring local_40 [8];
  wstring w;
  TWord *word_local;
  TLangModel *this_local;
  
  pwVar1 = word->Ptr;
  uVar2 = word->Len;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring(local_40,pwVar1,uVar2,&local_41);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_41);
  local_60._M_current =
       (bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>
        *)tsl::
          robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
          ::find(&(this->WordToId).
                  super_robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 ,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                  local_40);
  local_68._M_current =
       (bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>
        *)tsl::
          robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
          ::end(&(this->WordToId).
                 super_robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               );
  bVar3 = tsl::detail_robin_hash::operator!=
                    ((robin_iterator<true> *)&local_60,(robin_iterator<true> *)&local_68);
  if (bVar3) {
    pvVar4 = tsl::detail_robin_hash::
             robin_hash<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
             ::robin_iterator<true>::operator->((robin_iterator<true> *)&local_60);
    this_local._4_4_ = pvVar4->second;
  }
  else {
    this_local._4_4_ = this->UnknownWordId;
  }
  std::__cxx11::wstring::~wstring(local_40);
  return this_local._4_4_;
}

Assistant:

TWordId TLangModel::GetWordIdNoCreate(const TWord& word) const {
    std::wstring w(word.Ptr, word.Len);
    auto it = WordToId.find(w);
    if (it != WordToId.end()) {
        return it->second;
    }
    return UnknownWordId;
}